

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS meshb_real(FILE *file,REF_INT version,REF_DBL *real)

{
  size_t sVar1;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  double temp_double;
  REF_DBL *pRStack_28;
  float temp_float;
  REF_DBL *real_local;
  FILE *pFStack_18;
  REF_INT version_local;
  FILE *file_local;
  
  pRStack_28 = real;
  real_local._4_4_ = version;
  pFStack_18 = file;
  if (version == 1) {
    sVar1 = fread((void *)((long)&temp_double + 4),4,1,(FILE *)file);
    if (sVar1 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x561,"meshb_real","read float",1,sVar1);
      return 1;
    }
    *pRStack_28 = (double)temp_double._4_4_;
  }
  else {
    sVar1 = fread(&ref_private_status_reis_ai,8,1,(FILE *)file);
    if (sVar1 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x564,"meshb_real","read double",1,sVar1);
      return 1;
    }
    *pRStack_28 = (REF_DBL)ref_private_status_reis_ai;
  }
  return 0;
}

Assistant:

static REF_STATUS meshb_real(FILE *file, REF_INT version, REF_DBL *real) {
  float temp_float;
  double temp_double;

  if (1 == version) {
    REIS(1, fread(&temp_float, sizeof(temp_float), 1, file), "read float");
    *real = (REF_DBL)temp_float;
  } else {
    REIS(1, fread(&temp_double, sizeof(temp_double), 1, file), "read double");
    *real = (REF_DBL)temp_double;
  }

  return REF_SUCCESS;
}